

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# memory.c
# Opt level: O0

parasail_result_t * parasail_result_new_table3(int a,int b)

{
  void *pvVar1;
  size_t sVar2;
  size_t _size_5;
  size_t _size_4;
  size_t _size_3;
  size_t _size_2;
  size_t _size_1;
  size_t _size;
  parasail_result_t *result;
  int b_local;
  int a_local;
  
  if ((a < 1) || (b < 1)) {
    fprintf(_stderr,"%s: inputs must be > 0\n","parasail_result_new_table3");
    _b_local = (parasail_result_t *)0x0;
  }
  else {
    _b_local = parasail_result_new();
    if (_b_local == (parasail_result_t *)0x0) {
      _b_local = (parasail_result_t *)0x0;
    }
    else {
      pvVar1 = malloc(0x18);
      (_b_local->field_4).extra = pvVar1;
      if ((_b_local->field_4).extra == (void *)0x0) {
        fprintf(_stderr,"%s: failed to malloc %zu bytes\n","parasail_result_new_table3",0x18);
        _b_local = (parasail_result_t *)0x0;
      }
      else {
        pvVar1 = malloc(0x20);
        ((_b_local->field_4).trace)->trace_del_table = pvVar1;
        if (((_b_local->field_4).trace)->trace_del_table == (void *)0x0) {
          fprintf(_stderr,"%s: failed to malloc %zu bytes\n","parasail_result_new_table3",0x20);
          _b_local = (parasail_result_t *)0x0;
        }
        else {
          sVar2 = (long)(a * b) << 2;
          pvVar1 = malloc(sVar2);
          *(void **)((_b_local->field_4).trace)->trace_del_table = pvVar1;
          if (*((_b_local->field_4).trace)->trace_del_table == 0) {
            fprintf(_stderr,"%s: failed to malloc %zu bytes\n","parasail_result_new_table3",sVar2);
            _b_local = (parasail_result_t *)0x0;
          }
          else {
            sVar2 = (long)(a * b) << 2;
            pvVar1 = malloc(sVar2);
            *(void **)((long)((_b_local->field_4).trace)->trace_del_table + 8) = pvVar1;
            if (*(long *)((long)((_b_local->field_4).trace)->trace_del_table + 8) == 0) {
              fprintf(_stderr,"%s: failed to malloc %zu bytes\n","parasail_result_new_table3",sVar2)
              ;
              _b_local = (parasail_result_t *)0x0;
            }
            else {
              sVar2 = (long)(a * b) << 2;
              pvVar1 = malloc(sVar2);
              *(void **)((long)((_b_local->field_4).trace)->trace_del_table + 0x10) = pvVar1;
              if (*(long *)((long)((_b_local->field_4).trace)->trace_del_table + 0x10) == 0) {
                fprintf(_stderr,"%s: failed to malloc %zu bytes\n","parasail_result_new_table3",
                        sVar2);
                _b_local = (parasail_result_t *)0x0;
              }
              else {
                sVar2 = (long)(a * b) << 2;
                pvVar1 = malloc(sVar2);
                *(void **)((long)((_b_local->field_4).trace)->trace_del_table + 0x18) = pvVar1;
                if (*(long *)((long)((_b_local->field_4).trace)->trace_del_table + 0x18) == 0) {
                  fprintf(_stderr,"%s: failed to malloc %zu bytes\n","parasail_result_new_table3",
                          sVar2);
                  _b_local = (parasail_result_t *)0x0;
                }
              }
            }
          }
        }
      }
    }
  }
  return _b_local;
}

Assistant:

parasail_result_t* parasail_result_new_table3(const int a, const int b)
{
    /* declare all variables */
    parasail_result_t *result = NULL;

    VALIDATE_A_B
    
    /* allocate struct to hold memory */
    result = parasail_result_new();
    if (!result) return NULL;
    
    /* allocate only tables */
    PARASAIL_NEW(result->stats, parasail_result_extra_stats_t);
    PARASAIL_NEW(result->stats->tables, parasail_result_extra_stats_tables_t);
    PARASAIL_CALLOC(result->stats->tables->score_table, int, a*b);
    PARASAIL_CALLOC(result->stats->tables->matches_table, int, a*b);
    PARASAIL_CALLOC(result->stats->tables->similar_table, int, a*b);
    PARASAIL_CALLOC(result->stats->tables->length_table, int, a*b);

    return result;
}